

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::SceneGraph::store
               (Ref<embree::SceneGraph::Node> *root,FileName *filename,bool embedTextures,
               bool referenceMaterials,bool binaryFormat)

{
  undefined1 *puVar1;
  int iVar2;
  runtime_error *this;
  undefined7 in_register_00000011;
  bool bVar3;
  Ref<embree::SceneGraph::Node> local_a8;
  undefined4 local_9c;
  Ref<embree::SceneGraph::Node> *local_98;
  string local_90;
  string local_70;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  FileName::ext_abi_cxx11_(&local_70,filename);
  toLowerCase(&local_90,&local_70);
  local_9c = (undefined4)CONCAT71(in_register_00000011,embedTextures);
  local_98 = root;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"xml","");
  puVar1 = local_50;
  if (local_90._M_string_length == local_48) {
    if (local_90._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_90._M_dataplus._M_p,local_50,local_90._M_string_length);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (puVar1 != local_40) {
    operator_delete(puVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar3) {
    local_a8.ptr = local_98->ptr;
    if (local_a8.ptr != (Node *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    storeXML(&local_a8,filename,local_9c._0_1_,referenceMaterials,binaryFormat);
    if (local_a8.ptr != (Node *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  FileName::ext_abi_cxx11_(&local_70,filename);
  std::operator+(&local_90,"unknown scene format: ",&local_70);
  std::runtime_error::runtime_error(this,(string *)&local_90);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SceneGraph::store(Ref<SceneGraph::Node> root, const FileName& filename, bool embedTextures, bool referenceMaterials, bool binaryFormat)
  {
    if (toLowerCase(filename.ext()) == std::string("xml")) {
      storeXML(root,filename,embedTextures,referenceMaterials,binaryFormat);
    }
    else
      throw std::runtime_error("unknown scene format: " + filename.ext());
  }